

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idasSlCrank_FSA_dns.c
# Opt level: O0

void force(N_Vector yy,sunrealtype *Q,UserData data)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double *in_RDX;
  double *in_RSI;
  long *in_RDI;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  sunrealtype fl;
  sunrealtype f;
  sunrealtype ld;
  sunrealtype l;
  sunrealtype l2;
  sunrealtype c21;
  sunrealtype s21;
  sunrealtype c2;
  sunrealtype s2;
  sunrealtype c1;
  sunrealtype s1;
  sunrealtype pd;
  sunrealtype xd;
  sunrealtype qd;
  sunrealtype p;
  sunrealtype x;
  sunrealtype q;
  sunrealtype F;
  sunrealtype l0;
  sunrealtype c;
  sunrealtype k;
  sunrealtype a;
  
  dVar1 = *in_RDX;
  dVar2 = in_RDX[6];
  dVar3 = in_RDX[7];
  dVar4 = in_RDX[5];
  dVar5 = in_RDX[8];
  dVar11 = **(double **)(*in_RDI + 0x10);
  dVar6 = *(double *)(*(long *)(*in_RDI + 0x10) + 8);
  dVar13 = *(double *)(*(long *)(*in_RDI + 0x10) + 0x10);
  dVar7 = *(double *)(*(long *)(*in_RDI + 0x10) + 0x18);
  dVar8 = *(double *)(*(long *)(*in_RDI + 0x10) + 0x20);
  dVar9 = *(double *)(*(long *)(*in_RDI + 0x10) + 0x28);
  dVar10 = sin(dVar11);
  dVar11 = cos(dVar11);
  dVar12 = sin(dVar13);
  dVar13 = cos(dVar13);
  dVar14 = dVar12 * dVar11 + -(dVar13 * dVar10);
  dVar15 = sqrt(dVar6 * dVar6 + -(dVar6 * (dVar1 * dVar11 + dVar13)) + (dVar1 * dVar1 + 1.0) / 4.0 +
                (dVar1 * (dVar13 * dVar11 + dVar12 * dVar10)) / 2.0);
  dVar15 = (dVar2 * (dVar15 - dVar4) +
           dVar3 * (((dVar6 * (dVar12 * dVar9 + dVar1 * dVar10 * dVar7) +
                     dVar6 * 2.0 * dVar8 + -(dVar8 * (dVar1 * dVar11 + dVar13))) -
                    (dVar1 * dVar14 * (dVar9 - dVar7)) / 2.0) / (dVar15 * 2.0))) / dVar15;
  *in_RSI = (-dVar15 * dVar1 * (dVar6 * dVar10 + dVar14 / 2.0)) / 2.0;
  in_RSI[1] = dVar15 * ((dVar13 / 2.0 - dVar6) + (dVar1 * dVar11) / 2.0) + dVar5;
  in_RSI[2] = -dVar5 * dVar12 + (-dVar15 * (dVar6 * dVar12 + -((dVar1 * dVar14) / 2.0))) / 2.0;
  return;
}

Assistant:

static void force(N_Vector yy, sunrealtype* Q, UserData data)
{
  sunrealtype a, k, c, l0, F;
  sunrealtype q, x, p;
  sunrealtype qd, xd, pd;
  sunrealtype s1, c1, s2, c2, s21, c21;
  sunrealtype l2, l, ld;
  sunrealtype f, fl;

  a  = data->a;
  k  = data->params[0];
  c  = data->params[1];
  l0 = data->l0;
  F  = data->F;

  q = NV_Ith_S(yy, 0);
  x = NV_Ith_S(yy, 1);
  p = NV_Ith_S(yy, 2);

  qd = NV_Ith_S(yy, 3);
  xd = NV_Ith_S(yy, 4);
  pd = NV_Ith_S(yy, 5);

  s1  = sin(q);
  c1  = cos(q);
  s2  = sin(p);
  c2  = cos(p);
  s21 = s2 * c1 - c2 * s1;
  c21 = c2 * c1 + s2 * s1;

  l2 = x * x - x * (c2 + a * c1) + (ONE + a * a) / FOUR + a * c21 / TWO;
  l  = sqrt(l2);
  ld = TWO * x * xd - xd * (c2 + a * c1) + x * (s2 * pd + a * s1 * qd) -
       a * s21 * (pd - qd) / TWO;
  ld /= TWO * l;

  f  = k * (l - l0) + c * ld;
  fl = f / l;

  Q[0] = -fl * a * (s21 / TWO + x * s1) / TWO;
  Q[1] = fl * (c2 / TWO - x + a * c1 / TWO) + F;
  Q[2] = -fl * (x * s2 - a * s21 / TWO) / TWO - F * s2;
}